

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O2

void __thiscall spvtools::opt::Instruction::AddDebugLine(Instruction *this,Instruction *inst)

{
  pointer pIVar1;
  bool bVar2;
  uint32_t uVar3;
  DefUseManager *this_00;
  
  std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>::push_back
            (&this->dbg_line_insts_,inst);
  uVar3 = IRContext::TakeNextUniqueId(this->context_);
  (this->dbg_line_insts_).
  super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
  _M_impl.super__Vector_impl_data._M_finish[-1].unique_id_ = uVar3;
  bVar2 = IsDebugLineInst(inst);
  if (bVar2) {
    pIVar1 = (this->dbg_line_insts_).
             super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar3 = IRContext::TakeNextId(this->context_);
    SetResultId(pIVar1 + -1,uVar3);
  }
  if ((this->context_->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    return;
  }
  this_00 = IRContext::get_def_use_mgr(this->context_);
  analysis::DefUseManager::AnalyzeInstDefUse
            (this_00,(this->dbg_line_insts_).
                     super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                     ._M_impl.super__Vector_impl_data._M_finish + -1);
  return;
}

Assistant:

void Instruction::AddDebugLine(const Instruction* inst) {
  dbg_line_insts_.push_back(*inst);
  dbg_line_insts_.back().unique_id_ = context()->TakeNextUniqueId();
  if (inst->IsDebugLineInst())
    dbg_line_insts_.back().SetResultId(context_->TakeNextId());
  if (context()->AreAnalysesValid(IRContext::kAnalysisDefUse))
    context()->get_def_use_mgr()->AnalyzeInstDefUse(&dbg_line_insts_.back());
}